

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O3

uint32_t loader::anon_unknown_0::pe_reader::find_resource_entry(istream *is,uint32_t id)

{
  ushort uVar1;
  ulong in_RAX;
  long *plVar2;
  char *pcVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  char buffer [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  plVar2 = (long *)std::istream::seekg((long)is,0xc);
  uVar4 = 0;
  uVar5 = 0;
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar1 = uStack_38._4_2_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    if (id == 0xffffffff) {
      pcVar3 = (char *)std::istream::seekg((long)is,4);
      std::istream::read(pcVar3,(long)&uStack_38 + 4);
      uVar5 = 0;
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        uVar5 = uStack_38._4_4_;
      }
    }
    else {
      uVar6 = uStack_38 >> 0x20 & 0xffff;
      plVar2 = (long *)std::istream::seekg((long)is,(uint)uVar1 << 3);
      uVar5 = uVar4;
      if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) && (uVar6 != 0))
      {
        do {
          std::istream::read((char *)is,(long)&uStack_38 + 4);
          uVar4 = uStack_38._4_4_;
          std::istream::read((char *)is,(long)&uStack_38 + 4);
          if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
            return 0;
          }
          if (uVar4 == id) {
            return uStack_38._4_4_;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
  }
  return uVar5;
}

Assistant:

boost::uint32_t pe_reader::find_resource_entry(std::istream & is, boost::uint32_t id) {
	
	// skip: characteristics + timestamp + major version + minor version
	if(is.seekg(4 + 4 + 2 + 2, std::ios_base::cur).fail()) {
		return 0;
	}
	
	// Number of named resource entries.
	boost::uint16_t nbnames = util::load<boost::uint16_t>(is);
	
	// Number of id resource entries.
	boost::uint16_t nbids = util::load<boost::uint16_t>(is);
	
	if(id == Default) {
		boost::uint32_t offset = util::load<boost::uint32_t>(is.seekg(4, std::ios_base::cur));
		return is.fail() ? 0 : offset;
	}
	
	// Ignore named resource entries.
	const boost::uint32_t entry_size = 4 + 4; // id / string address + offset
	if(is.seekg(nbnames * entry_size, std::ios_base::cur).fail()) {
		return 0;
	}
	
	for(size_t i = 0; i < nbids; i++) {
		
		boost::uint32_t entry_id = util::load<boost::uint32_t>(is);
		boost::uint32_t entry_offset = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			return 0;
		}
		
		if(entry_id == id) {
			return entry_offset;
		}
		
	}
	
	return 0;
}